

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_io_components_pass.cpp
# Opt level: O0

uint __thiscall
spvtools::opt::EliminateDeadIOComponentsPass::FindMaxIndex
          (EliminateDeadIOComponentsPass *this,Instruction *var,uint original_max,
          bool skip_first_index)

{
  Op OVar1;
  uint32_t id;
  IRContext *this_00;
  DefUseManager *this_01;
  uint local_fc;
  anon_class_144_5_fc165401 local_d8;
  function<bool_(spvtools::opt::Instruction_*)> local_48;
  bool local_25;
  uint local_24;
  bool seen_non_const_ac;
  uint max;
  bool skip_first_index_local;
  Instruction *pIStack_18;
  uint original_max_local;
  Instruction *var_local;
  EliminateDeadIOComponentsPass *this_local;
  
  local_24 = 0;
  local_25 = false;
  seen_non_const_ac = skip_first_index;
  max = original_max;
  pIStack_18 = var;
  var_local = (Instruction *)this;
  OVar1 = opt::Instruction::opcode(var);
  if (OVar1 != OpVariable) {
    __assert_fail("var.opcode() == spv::Op::OpVariable && \"must be variable\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_io_components_pass.cpp"
                  ,0x95,
                  "unsigned int spvtools::opt::EliminateDeadIOComponentsPass::FindMaxIndex(const Instruction &, const unsigned int, const bool)"
                 );
  }
  this_00 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_def_use_mgr(this_00);
  id = opt::Instruction::result_id(pIStack_18);
  local_d8.max = &local_24;
  local_d8.seen_non_const_ac = &local_25;
  opt::Instruction::Instruction(&local_d8.var,pIStack_18);
  local_d8.skip_first_index = (bool)(seen_non_const_ac & 1);
  local_d8.this = this;
  std::function<bool(spvtools::opt::Instruction*)>::
  function<spvtools::opt::EliminateDeadIOComponentsPass::FindMaxIndex(spvtools::opt::Instruction_const&,unsigned_int,bool)::__0,void>
            ((function<bool(spvtools::opt::Instruction*)> *)&local_48,&local_d8);
  analysis::DefUseManager::WhileEachUser(this_01,id,&local_48);
  std::function<bool_(spvtools::opt::Instruction_*)>::~function(&local_48);
  FindMaxIndex(spvtools::opt::Instruction_const&,unsigned_int,bool)::$_0::~__0((__0 *)&local_d8);
  if ((local_25 & 1U) == 0) {
    local_fc = local_24;
  }
  else {
    local_fc = max;
  }
  return local_fc;
}

Assistant:

unsigned EliminateDeadIOComponentsPass::FindMaxIndex(
    const Instruction& var, const unsigned original_max,
    const bool skip_first_index) {
  unsigned max = 0;
  bool seen_non_const_ac = false;
  assert(var.opcode() == spv::Op::OpVariable && "must be variable");
  context()->get_def_use_mgr()->WhileEachUser(
      var.result_id(), [&max, &seen_non_const_ac, var, skip_first_index,
                        this](Instruction* use) {
        auto use_opcode = use->opcode();
        if (use_opcode == spv::Op::OpLoad || use_opcode == spv::Op::OpStore ||
            use_opcode == spv::Op::OpCopyMemory ||
            use_opcode == spv::Op::OpCopyMemorySized ||
            use_opcode == spv::Op::OpCopyObject) {
          seen_non_const_ac = true;
          return false;
        }
        if (use->opcode() != spv::Op::OpAccessChain &&
            use->opcode() != spv::Op::OpInBoundsAccessChain) {
          return true;
        }
        // OpAccessChain with no indices currently not optimized
        if (use->NumInOperands() == 1 ||
            (skip_first_index && use->NumInOperands() == 2)) {
          seen_non_const_ac = true;
          return false;
        }
        const unsigned base_id =
            use->GetSingleWordInOperand(kAccessChainBaseInIdx);
        USE_ASSERT(base_id == var.result_id() && "unexpected base");
        const unsigned in_idx = skip_first_index ? kAccessChainIndex1InIdx
                                                 : kAccessChainIndex0InIdx;
        const unsigned idx_id = use->GetSingleWordInOperand(in_idx);
        Instruction* idx_inst = context()->get_def_use_mgr()->GetDef(idx_id);
        if (idx_inst->opcode() != spv::Op::OpConstant) {
          seen_non_const_ac = true;
          return false;
        }
        unsigned value = idx_inst->GetSingleWordInOperand(kConstantValueInIdx);
        if (value > max) max = value;
        return true;
      });
  return seen_non_const_ac ? original_max : max;
}